

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::updateFileInfo(Parser *this)

{
  int iVar1;
  pointer pFVar2;
  Token *pTVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (this->overrideFileInfo == true) {
    Global.FileInfo.FileNum = this->overrideFileNum;
    Global.FileInfo.LineNumber = this->overrideLineNum;
  }
  else {
    pFVar2 = (this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->entries).
                  super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pFVar2;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      lVar6 = lVar4 * 8 + -8;
      lVar5 = 0;
      do {
        if ((*(char *)((long)pFVar2 + lVar6 + -8) == '\0') &&
           (iVar1 = *(int *)((long)pFVar2 + lVar6 + -4), iVar1 != -1)) {
          Global.FileInfo.FileNum = iVar1;
          if (lVar5 != 0) {
            Global.FileInfo.LineNumber = *(int *)((long)&pFVar2->tokenizer + lVar6);
            return;
          }
          pTVar3 = Tokenizer::peekToken(*(Tokenizer **)((long)pFVar2 + lVar6 + -0x10),0);
          iVar1 = (int)pTVar3->line;
          Global.FileInfo.LineNumber = iVar1;
          *(int *)((long)&((this->entries).
                           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start)->tokenizer + lVar6) = iVar1;
          return;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + -0x18;
      } while (lVar4 * -0x5555555555555555 - lVar5 != 0);
    }
  }
  return;
}

Assistant:

void Parser::updateFileInfo()
{
	if (overrideFileInfo)
	{
		Global.FileInfo.FileNum = overrideFileNum;
		Global.FileInfo.LineNumber = overrideLineNum;
		return;
	}

	for (size_t i = entries.size(); i > 0; i--)
	{
		size_t index = i-1;

		if (!entries[index].virtualFile && entries[index].fileNum != -1)
		{
			Global.FileInfo.FileNum = entries[index].fileNum;

			// if it's not the topmost file, then the command to instantiate the
			// following files was already parsed -> take the previous command's line
			if (index != entries.size() - 1)
				Global.FileInfo.LineNumber = entries[index].previousCommandLine;
			else
			{
				Global.FileInfo.LineNumber = (int)entries[index].tokenizer->peekToken().line;
				entries[index].previousCommandLine = Global.FileInfo.LineNumber;
			}
			return;
		}
	}
}